

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O2

RunElement __thiscall
duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>::StartGames
          (MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *this,
          Games *losers,RunElements *elements,RunElement *sentinel)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  pair<unsigned_int,_unsigned_long> *ppVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  pair<unsigned_int,_unsigned_long> *ppVar10;
  RunElement RVar11;
  Games winners;
  uint auStack_218 [2];
  undefined1 auStack_210 [8];
  uint auStack_208 [2];
  array<std::pair<unsigned_int,_unsigned_long>,_31UL> local_200;
  
  auStack_210 = (undefined1  [8])0x1ac08f2;
  ::std::array<std::pair<unsigned_int,_unsigned_long>,_31UL>::array(&local_200);
  lVar4 = 0;
  lVar2 = 0xf8;
  ppVar5 = elements->_M_elems;
  for (; lVar2 != 0x1f8; lVar2 = lVar2 + 0x10) {
    uVar8 = ((pair<unsigned_int,_unsigned_long> *)&ppVar5->first)->first;
    uVar7 = ppVar5[1].first;
    ppVar10 = ppVar5;
    if (uVar8 < uVar7) {
      uVar9 = ppVar5[1].second;
    }
    else if ((uVar7 < uVar8) || (uVar9 = ppVar5[1].second, ppVar5[1].second <= ppVar5->second)) {
      uVar9 = ppVar5->second;
      ppVar10 = elements->_M_elems + lVar4 * 2 + 1;
      uVar7 = uVar8;
    }
    *(uint *)((long)losers->_M_elems + lVar2 + -8) = uVar7;
    *(ulong *)((long)&losers->_M_elems[0].first + lVar2) = uVar9;
    *(uint *)((long)auStack_208 + lVar2) =
         ((pair<unsigned_int,_unsigned_long> *)&ppVar10->first)->first;
    *(unsigned_long *)((long)&local_200._M_elems[0].first + lVar2) = ppVar10->second;
    lVar4 = lVar4 + 1;
    ppVar5 = ppVar5 + 2;
  }
  for (lVar2 = 0xf4; lVar2 != 4; lVar2 = lVar2 + -0x10) {
    uVar8 = *(uint *)((long)auStack_218 + lVar2 * 2);
    uVar7 = *(uint *)((long)auStack_208 + lVar2 * 2);
    if (uVar8 < uVar7) {
      uVar6 = *(ulong *)(auStack_210 + lVar2 * 2);
      uVar9 = *(ulong *)((long)&local_200._M_elems[0].first + lVar2 * 2);
      uVar3 = uVar8;
      uVar8 = uVar7;
    }
    else {
      uVar9 = *(ulong *)(auStack_210 + lVar2 * 2);
      uVar1 = *(ulong *)((long)&local_200._M_elems[0].first + lVar2 * 2);
      uVar6 = uVar1;
      uVar3 = uVar7;
      if (uVar8 <= uVar7 && uVar9 < uVar1) {
        uVar6 = uVar9;
        uVar9 = uVar1;
        uVar3 = uVar8;
        uVar8 = uVar7;
      }
    }
    *(uint *)((long)losers->_M_elems + lVar2 + -0x14) = uVar8;
    *(ulong *)((long)losers->_M_elems + lVar2 + -0xc) = uVar9;
    *(uint *)(auStack_210 + lVar2 + -4) = uVar3;
    *(ulong *)(auStack_210 + lVar2 + 4) = uVar6;
  }
  RVar11._4_4_ = 0;
  RVar11.first = local_200._M_elems[0].first;
  RVar11.second = local_200._M_elems[0].second;
  return RVar11;
}

Assistant:

RunElement StartGames(Games &losers, const RunElements &elements, const RunElement &sentinel) {
		const auto elem_nodes = elements.size();
		const auto game_nodes = losers.size();
		Games winners;

		//	Play the first round of games,
		//	placing the losers at the bottom of the game
		const auto base_offset = game_nodes / 2;
		auto losers_base = losers.data() + base_offset;
		auto winners_base = winners.data() + base_offset;

		const auto base_count = elem_nodes / 2;
		for (idx_t i = 0; i < base_count; ++i) {
			const auto &e0 = elements[i * 2 + 0];
			const auto &e1 = elements[i * 2 + 1];
			if (cmp(e0, e1)) {
				losers_base[i] = e1;
				winners_base[i] = e0;
			} else {
				losers_base[i] = e0;
				winners_base[i] = e1;
			}
		}

		//	Fill in any byes
		if (elem_nodes % 2) {
			winners_base[base_count] = elements.back();
			losers_base[base_count] = sentinel;
		}

		//	Pad to a power of 2
		const auto base_size = (game_nodes + 1) / 2;
		for (idx_t i = (elem_nodes + 1) / 2; i < base_size; ++i) {
			winners_base[i] = sentinel;
			losers_base[i] = sentinel;
		}

		//	Play the winners against each other
		//	and stick the losers in the upper levels of the tournament tree
		for (idx_t i = base_offset; i-- > 0;) {
			//	Indexing backwards
			const auto &e0 = winners[i * 2 + 1];
			const auto &e1 = winners[i * 2 + 2];
			if (cmp(e0, e1)) {
				losers[i] = e1;
				winners[i] = e0;
			} else {
				losers[i] = e0;
				winners[i] = e1;
			}
		}

		//	Return the final winner
		return winners[0];
	}